

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test::testBody
          (TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  undefined1 local_a0 [8];
  MockUnexpectedCallHappenedFailure expectedFailure;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_b0,"scope2::lazy");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_a0,test,&local_b0,
             (MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_c0,"scope1");
  pMVar1 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"lazy");
  (*pMVar1->_vptr_MockSupport[4])(pMVar1,&local_d0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_e0,"scope2");
  pMVar1 = mock(&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_f0,"lazy");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_f0);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x11d);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_a0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeButActualCallInAnotherScope)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope2::lazy", expectations);

    mock("scope1").expectNoCall("lazy");
    mock("scope2").actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}